

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O0

void __thiscall bdHistory::clearHistory(bdHistory *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_> local_18;
  iterator it;
  bdHistory *this_local;
  
  it._M_node = (_Base_ptr)this;
  std::_Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_>::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<bdId,_bdMsgHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdMsgHistoryList>_>_>
             ::begin(&this->mHistory);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<bdId,_bdMsgHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdMsgHistoryList>_>_>
         ::end(&this->mHistory);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_>::operator->(&local_18)
    ;
    bdMsgHistoryList::clearHistory(&ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_bdId,_bdMsgHistoryList>_>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void bdHistory::clearHistory() {
	// Switched to a alternative clear, so we don't drop peers, and remember their type.
	//mHistory.clear();
	std::map<bdId, bdMsgHistoryList> ::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); it++) {
		it->second.clearHistory();
	}
}